

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O0

sc_string_old sc_dt::operator+(char *s,sc_string_old *t)

{
  size_t sVar1;
  sc_string_rep *r_00;
  char *__dest;
  char *__src;
  sc_string_old *in_RDX;
  char *in_RSI;
  sc_string_rep *in_RDI;
  sc_string_rep *r;
  int len;
  undefined8 in_stack_ffffffffffffff98;
  int size;
  sc_string_rep *this;
  
  size = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  this = in_RDI;
  sVar1 = strlen(in_RSI);
  r_00 = (sc_string_rep *)operator_new(0x10);
  sc_string_old::length((sc_string_old *)0x2f1e44);
  sc_string_rep::sc_string_rep(this,size);
  strcpy(r_00->str,in_RSI);
  __dest = r_00->str + (int)sVar1;
  __src = sc_string_old::operator_cast_to_char_(in_RDX);
  strcpy(__dest,__src);
  sc_string_old::sc_string_old((sc_string_old *)this,r_00);
  return (sc_string_old)in_RDI;
}

Assistant:

sc_string_old
operator+( const char* s, const sc_string_old& t )
{
    int len = strlen(s);
    sc_string_rep* r = new sc_string_rep( len + t.length() + 1 );
    strcpy( r->str, s );
    strcpy( r->str + len, t );
    return sc_string_old(r);
}